

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O0

int32 gauden_param_read(vector_t ****out_param,int32 *out_n_mgau,int32 *out_n_feat,
                       int32 *out_n_density,int32 **out_veclen,char *file_name)

{
  int32 iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar5;
  uint32 local_a4;
  char **ppcStack_a0;
  uint32 chksum;
  char **argval;
  char **argname;
  float32 *buf;
  vector_t ***out;
  int32 chksum_present;
  int32 byteswap;
  int32 *veclen;
  uint local_68;
  int32 n_density;
  int32 n_feat;
  int32 n_mgau;
  int32 blk;
  int32 n;
  int32 l;
  int32 k;
  int32 j;
  int32 i;
  FILE *fp;
  char *pcStack_38;
  char tmp;
  char *file_name_local;
  int32 **out_veclen_local;
  int32 *out_n_density_local;
  int32 *out_n_feat_local;
  int32 *out_n_mgau_local;
  vector_t ****out_param_local;
  
  pcStack_38 = file_name;
  file_name_local = (char *)out_veclen;
  out_veclen_local = (int32 **)out_n_density;
  out_n_density_local = out_n_feat;
  out_n_feat_local = out_n_mgau;
  out_n_mgau_local = (int32 *)out_param;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
          ,0xd5,"Reading mixture gaussian parameter: %s\n",file_name);
  _j = fopen(pcStack_38,"rb");
  if (_j == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                   ,0xd8,"fopen(%s,rb) failed\n",pcStack_38);
    exit(1);
  }
  iVar1 = bio_readhdr((FILE *)_j,&argval,&stack0xffffffffffffff60,(int32 *)((long)&out + 4));
  if (iVar1 < 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
            ,0xdc,"bio_readhdr(%s) failed\n",pcStack_38);
    exit(1);
  }
  out._0_4_ = 0;
  for (k = 0; uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20),
      argval[k] != (char *)0x0; k = k + 1) {
    iVar2 = strcmp(argval[k],"version");
    if (iVar2 == 0) {
      iVar2 = strcmp(ppcStack_a0[k],"1.0");
      if (iVar2 != 0) {
        in_stack_ffffffffffffff38 = 0;
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                ,0xe4,"Version mismatch(%s): %s, expecting %s\n",pcStack_38,ppcStack_a0[k],"1.0");
      }
    }
    else {
      iVar2 = strcmp(argval[k],"chksum0");
      if (iVar2 == 0) {
        out._0_4_ = 1;
      }
    }
  }
  bio_hdrarg_free(argval,ppcStack_a0);
  ppcStack_a0 = (char **)0x0;
  argval = (char **)0x0;
  local_a4 = 0;
  iVar1 = bio_fread(&n_density,4,1,(FILE *)_j,out._4_4_,&local_a4);
  if (iVar1 != 1) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
            ,0xf1,"fread(%s) (#codebooks) failed\n",pcStack_38);
    exit(1);
  }
  *out_n_feat_local = n_density;
  iVar1 = bio_fread(&local_68,4,1,(FILE *)_j,out._4_4_,&local_a4);
  if (iVar1 != 1) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
            ,0xf6,"fread(%s) (#features) failed\n",pcStack_38);
    exit(1);
  }
  *out_n_density_local = local_68;
  iVar1 = bio_fread((void *)((long)&veclen + 4),4,1,(FILE *)_j,out._4_4_,&local_a4);
  if (iVar1 != 1) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
            ,0xfc,"fread(%s) (#density/codebook) failed\n",pcStack_38);
    exit(1);
  }
  *(uint *)out_veclen_local = veclen._4_4_;
  _chksum_present =
       __ckd_calloc__((long)(int)local_68,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                      ,0x100);
  *(void **)file_name_local = _chksum_present;
  uVar3 = bio_fread(_chksum_present,4,local_68,(FILE *)_j,out._4_4_,&local_a4);
  if (uVar3 != local_68) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
            ,0x104,"fread(%s) (feature-lengths) failed\n",pcStack_38);
    exit(1);
  }
  n_feat = 0;
  for (k = 0; k < (int)local_68; k = k + 1) {
    n_feat = *(int *)((long)_chksum_present + (long)k * 4) + n_feat;
  }
  iVar1 = bio_fread(&n_mgau,4,1,(FILE *)_j,out._4_4_,&local_a4);
  if (iVar1 != 1) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
            ,0x10c,"fread(%s) (total #floats) failed\n",pcStack_38);
    exit(1);
  }
  if (n_mgau != n_density * veclen._4_4_ * n_feat) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
            ,0x110,"%s: #float32s(%d) doesn\'t match dimensions: %d x %d x %d\n",pcStack_38,
            (ulong)(uint)n_mgau,CONCAT44(uVar5,n_density),veclen._4_4_,n_feat);
    exit(1);
  }
  if (*(long *)out_n_mgau_local == 0) {
    buf = (float32 *)
          __ckd_calloc_3d__((long)n_density,(long)(int)local_68,(long)(int)veclen._4_4_,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                            ,0x116);
    argname = (char **)__ckd_calloc__((long)n_mgau,4,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                                      ,0x117);
    blk = 0;
    for (k = 0; k < n_density; k = k + 1) {
      for (l = 0; l < (int)local_68; l = l + 1) {
        for (n = 0; n < (int)veclen._4_4_; n = n + 1) {
          *(void **)(*(long *)(*(long *)(buf + (long)k * 2) + (long)l * 8) + (long)n * 8) =
               (void *)((long)argname + (long)blk * 4);
          blk = *(int *)((long)_chksum_present + (long)l * 4) + blk;
        }
      }
    }
  }
  else {
    buf = *(float32 **)out_n_mgau_local;
    argname = *(char ***)**(undefined8 **)buf;
  }
  iVar1 = bio_fread(argname,4,n_mgau,(FILE *)_j,out._4_4_,&local_a4);
  if (iVar1 == n_mgau) {
    if ((int)out != 0) {
      bio_verify_chksum((FILE *)_j,out._4_4_,local_a4);
    }
    sVar4 = fread((void *)((long)&fp + 7),1,1,_j);
    if (sVar4 != 1) {
      fclose(_j);
      *(float32 **)out_n_mgau_local = buf;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
              ,0x135,"%d codebook, %d feature, size\n",(ulong)(uint)n_density,(ulong)local_68);
      for (k = 0; k < (int)local_68; k = k + 1) {
        printf(" %dx%d",(ulong)veclen._4_4_,(ulong)*(uint *)((long)_chksum_present + (long)k * 4));
      }
      printf("\n");
      fflush(_stdout);
      return 0;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
            ,0x12f,"More data than expected in %s\n",pcStack_38);
    exit(1);
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
          ,0x129,"fread(%s) (densitydata) failed\n",pcStack_38);
  exit(1);
}

Assistant:

static int32
gauden_param_read(vector_t **** out_param,      /* Alloc space iff *out_param == NULL */
                  int32 * out_n_mgau,
                  int32 * out_n_feat,
                  int32 * out_n_density,
                  int32 ** out_veclen, const char *file_name)
{
    char tmp;
    FILE *fp;
    int32 i, j, k, l, n, blk;
    int32 n_mgau;
    int32 n_feat;
    int32 n_density;
    int32 *veclen;
    int32 byteswap, chksum_present;
    vector_t ***out;
    float32 *buf;
    char **argname, **argval;
    uint32 chksum;

    E_INFO("Reading mixture gaussian parameter: %s\n", file_name);

    if ((fp = fopen(file_name, "rb")) == NULL)
        E_FATAL_SYSTEM("fopen(%s,rb) failed\n", file_name);

    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr(fp, &argname, &argval, &byteswap) < 0)
        E_FATAL("bio_readhdr(%s) failed\n", file_name);

    /* Parse argument-value list */
    chksum_present = 0;
    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
            if (strcmp(argval[i], GAUDEN_PARAM_VERSION) != 0)
                E_WARN("Version mismatch(%s): %s, expecting %s\n",
                       file_name, argval[i], GAUDEN_PARAM_VERSION);
        }
        else if (strcmp(argname[i], "chksum0") == 0) {
            chksum_present = 1; /* Ignore the associated value */
        }
    }
    bio_hdrarg_free(argname, argval);
    argname = argval = NULL;

    chksum = 0;

    /* #Codebooks */
    if (bio_fread(&n_mgau, sizeof(int32), 1, fp, byteswap, &chksum) != 1)
        E_FATAL("fread(%s) (#codebooks) failed\n", file_name);
    *out_n_mgau = n_mgau;

    /* #Features/codebook */
    if (bio_fread(&n_feat, sizeof(int32), 1, fp, byteswap, &chksum) != 1)
        E_FATAL("fread(%s) (#features) failed\n", file_name);
    *out_n_feat = n_feat;

    /* #Gaussian densities/feature in each codebook */
    if (bio_fread(&n_density, sizeof(int32), 1, fp, byteswap, &chksum) !=
        1)
        E_FATAL("fread(%s) (#density/codebook) failed\n", file_name);
    *out_n_density = n_density;

    /* #Dimensions in each feature stream */
    veclen = ckd_calloc(n_feat, sizeof(uint32));
    *out_veclen = veclen;
    if (bio_fread(veclen, sizeof(int32), n_feat, fp, byteswap, &chksum) !=
        n_feat)
        E_FATAL("fread(%s) (feature-lengths) failed\n", file_name);

    /* blk = total vector length of all feature streams */
    for (i = 0, blk = 0; i < n_feat; i++)
        blk += veclen[i];

    /* #Floats to follow; for the ENTIRE SET of CODEBOOKS */
    if (bio_fread(&n, sizeof(int32), 1, fp, byteswap, &chksum) != 1)
        E_FATAL("fread(%s) (total #floats) failed\n", file_name);
    if (n != n_mgau * n_density * blk) {
        E_FATAL
            ("%s: #float32s(%d) doesn't match dimensions: %d x %d x %d\n",
             file_name, n, n_mgau, n_density, blk);
    }

    /* Allocate memory for mixture gaussian densities if not already allocated */
    if (!(*out_param)) {
        out = (vector_t ***) ckd_calloc_3d(n_mgau, n_feat, n_density,
                                           sizeof(vector_t));
        buf = (float32 *) ckd_calloc(n, sizeof(float));
        for (i = 0, l = 0; i < n_mgau; i++) {
            for (j = 0; j < n_feat; j++) {
                for (k = 0; k < n_density; k++) {
                    out[i][j][k] = &buf[l];

                    l += veclen[j];
                }
            }
        }
    }
    else {
        out = *out_param;
        buf = out[0][0][0];
    }

    /* Read mixture gaussian densities data */
    if (bio_fread(buf, sizeof(float32), n, fp, byteswap, &chksum) != n)
        E_FATAL("fread(%s) (densitydata) failed\n", file_name);

    if (chksum_present)
        bio_verify_chksum(fp, byteswap, chksum);

    if (fread(&tmp, 1, 1, fp) == 1)
        E_FATAL("More data than expected in %s\n", file_name);

    fclose(fp);

    *out_param = out;

    E_INFO("%d codebook, %d feature, size\n", n_mgau, n_feat);
    for (i = 0; i < n_feat; i++)
        printf(" %dx%d", n_density, veclen[i]);
    printf("\n");
    fflush(stdout);

    return 0;
}